

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_mult_m(REF_DBL *m1,REF_DBL *m2,REF_DBL *product)

{
  *product = m1[2] * m2[2] + *m1 * *m2 + m1[1] * m2[1];
  product[1] = m1[4] * m2[2] + m1[1] * *m2 + m1[3] * m2[1];
  product[2] = m1[5] * m2[2] + m1[2] * *m2 + m1[4] * m2[1];
  product[3] = m1[2] * m2[4] + *m1 * m2[1] + m1[1] * m2[3];
  product[4] = m1[4] * m2[4] + m1[1] * m2[1] + m1[3] * m2[3];
  product[5] = m1[5] * m2[4] + m1[2] * m2[1] + m1[4] * m2[3];
  product[6] = m1[2] * m2[5] + *m1 * m2[2] + m1[1] * m2[4];
  product[7] = m1[4] * m2[5] + m1[1] * m2[2] + m1[3] * m2[4];
  product[8] = m1[5] * m2[5] + m1[2] * m2[2] + m1[4] * m2[4];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_mult_m(REF_DBL *m1, REF_DBL *m2,
                                     REF_DBL *product) {
  /* first col */
  product[0] = m1[0] * m2[0] + m1[1] * m2[1] + m1[2] * m2[2];
  product[1] = m1[1] * m2[0] + m1[3] * m2[1] + m1[4] * m2[2];
  product[2] = m1[2] * m2[0] + m1[4] * m2[1] + m1[5] * m2[2];

  /* mid col */
  product[3] = m1[0] * m2[1] + m1[1] * m2[3] + m1[2] * m2[4];
  product[4] = m1[1] * m2[1] + m1[3] * m2[3] + m1[4] * m2[4];
  product[5] = m1[2] * m2[1] + m1[4] * m2[3] + m1[5] * m2[4];

  /* last col */
  product[6] = m1[0] * m2[2] + m1[1] * m2[4] + m1[2] * m2[5];
  product[7] = m1[1] * m2[2] + m1[3] * m2[4] + m1[4] * m2[5];
  product[8] = m1[2] * m2[2] + m1[4] * m2[4] + m1[5] * m2[5];

  return REF_SUCCESS;
}